

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O2

V3f __thiscall
Imf_3_2::CubeMap::direction(CubeMap *this,CubeMapFace face,Box2i *dataWindow,V2f *positionInFace)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  V3f VVar9;
  
  iVar1 = sizeOfFace(dataWindow);
  uVar2 = 0;
  if (1 < iVar1) {
    fVar5 = (float)(iVar1 + -1);
    auVar3._8_8_ = 0;
    auVar3._0_4_ = positionInFace->x;
    auVar3._4_4_ = positionInFace->y;
    auVar4._4_4_ = fVar5;
    auVar4._0_4_ = fVar5;
    auVar4._8_4_ = fVar5;
    auVar4._12_4_ = fVar5;
    auVar4 = divps(auVar3,auVar4);
    uVar2 = CONCAT44(auVar4._4_4_ + auVar4._4_4_ + -1.0,auVar4._0_4_ + auVar4._0_4_ + -1.0);
  }
  fVar5 = 1.0;
  *(undefined8 *)this = 0x3f800000;
  *(undefined4 *)(this + 8) = 0;
  fVar6 = (float)uVar2;
  uVar8 = (undefined4)((ulong)uVar2 >> 0x20);
  uVar7 = uVar8;
  switch(face) {
  case CUBEFACE_POS_X:
    goto switchD_00181171_caseD_0;
  case CUBEFACE_NEG_X:
    fVar6 = -1.0;
    goto LAB_001811c2;
  case CUBEFACE_POS_Y:
    uVar7 = 0x3f800000;
    break;
  case CUBEFACE_NEG_Y:
    uVar7 = 0xbf800000;
    break;
  case CUBEFACE_POS_Z:
    uVar8 = 0x3f800000;
    break;
  case CUBEFACE_NEG_Z:
    uVar8 = 0xbf800000;
    break;
  default:
switchD_00181171_default:
    VVar9.z = fVar5;
    VVar9.x = (float)(int)uVar2;
    VVar9.y = (float)(int)((ulong)uVar2 >> 0x20);
    return VVar9;
  }
  uVar2 = CONCAT44(uVar8,uVar7);
LAB_001811c2:
  *(float *)this = fVar6;
  fVar5 = fVar6;
switchD_00181171_caseD_0:
  *(undefined8 *)(this + 4) = uVar2;
  goto switchD_00181171_default;
}

Assistant:

V3f
direction (CubeMapFace face, const Box2i& dataWindow, const V2f& positionInFace)
{
    int sof = sizeOfFace (dataWindow);

    V2f pos;

    if (sof > 1)
    {
        pos = V2f (
            positionInFace.x / (sof - 1) * 2 - 1,
            positionInFace.y / (sof - 1) * 2 - 1);
    }
    else
    {
        pos = V2f (0, 0);
    }

    V3f dir (1, 0, 0);

    switch (face)
    {
        case CUBEFACE_POS_X:

            dir.x = 1;
            dir.y = pos.x;
            dir.z = pos.y;
            break;

        case CUBEFACE_NEG_X:

            dir.x = -1;
            dir.y = pos.x;
            dir.z = pos.y;
            break;

        case CUBEFACE_POS_Y:

            dir.x = pos.x;
            dir.y = 1;
            dir.z = pos.y;
            break;

        case CUBEFACE_NEG_Y:

            dir.x = pos.x;
            dir.y = -1;
            dir.z = pos.y;
            break;

        case CUBEFACE_POS_Z:

            dir.x = pos.x;
            dir.y = pos.y;
            dir.z = 1;
            break;

        case CUBEFACE_NEG_Z:

            dir.x = pos.x;
            dir.y = pos.y;
            dir.z = -1;
            break;
    }

    return dir;
}